

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  float *pfVar1;
  ImGuiWindow **ppIVar2;
  ImVec2 *pIVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  long lVar6;
  ImS8 *pIVar7;
  ImU16 *pIVar8;
  float fVar9;
  char cVar10;
  ImGuiNavLayer IVar11;
  ImGuiID IVar12;
  ImGuiContextHook *pIVar13;
  ImFontAtlas *pIVar14;
  uint *puVar15;
  ImGuiViewportP *pIVar16;
  ImGuiInputEvent *pIVar17;
  ImGuiTableTempData *pIVar18;
  ImGuiWindowStackData *pIVar19;
  ImGuiPopupData *pIVar20;
  ImGuiGroupData *pIVar21;
  ImGuiStackLevelInfo *pIVar22;
  undefined1 auVar23 [12];
  undefined8 uVar24;
  bool bVar25;
  ImGuiContext *pIVar26;
  ImGuiContext *pIVar27;
  undefined3 uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ImU16 IVar33;
  uint uVar34;
  ImGuiID IVar35;
  ImGuiInputSource IVar36;
  ImGuiNavLayer layer;
  ImGuiDir IVar37;
  ImGuiContext *ctx;
  uint *__dest;
  ImGuiInputEvent *__dest_00;
  ImGuiKeyData *pIVar38;
  ImGuiWindow *pIVar39;
  ImGuiWindowStackData *__dest_01;
  ImGuiPopupData *__dest_02;
  int *piVar40;
  int *piVar41;
  ImGuiGroupData *__dest_03;
  ImGuiStackLevelInfo *__dest_04;
  int i;
  int iVar42;
  ImGuiDir IVar43;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *window_00;
  char *pcVar44;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar45;
  ImRect *pIVar46;
  ImGuiContext *g;
  int iVar47;
  ImGuiID IVar48;
  bool *pbVar49;
  ImGuiID IVar50;
  float *pfVar51;
  ImFont *font;
  float *pfVar52;
  ImGuiWindow *old_nav_window;
  ImGuiContext *g_2;
  ImGuiContext *pIVar53;
  ImGuiWindow *window;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  ImGuiContext *g_7;
  long lVar57;
  ImGuiContext *pIVar58;
  bool bVar59;
  byte bVar60;
  uint uVar61;
  float fVar62;
  ImVec2 IVar63;
  ImVec2 IVar64;
  ImVec2 IVar65;
  ImVec2 IVar66;
  ImVec2 IVar67;
  ImVec4 IVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar83;
  float fVar73;
  float fVar74;
  ImVec2 IVar75;
  int iVar84;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar82;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ImRect local_48;
  undefined1 auVar76 [16];
  
  pIVar26 = GImGui;
  bVar60 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x10ba,"void ImGui::NewFrame()");
  }
  uVar34 = (GImGui->Hooks).Size;
  uVar54 = (ulong)(int)uVar34;
  if (0 < (long)uVar54) {
    lVar57 = -uVar54;
    lVar55 = uVar54 << 5;
    do {
      if ((long)(int)uVar34 < (long)uVar54) {
        pcVar44 = "T &ImVector<ImGuiContextHook>::operator[](int) [T = ImGuiContextHook]";
        goto LAB_00131c6c;
      }
      pIVar13 = (pIVar26->Hooks).Data;
      if (*(int *)(pIVar13 + lVar55 + -0x1c) == 7) {
        memmove(pIVar13 + lVar55 + -0x20,pIVar13 + lVar55,((ulong)uVar34 + lVar57) * 0x20);
        uVar34 = (pIVar26->Hooks).Size - 1;
        (pIVar26->Hooks).Size = uVar34;
      }
      lVar57 = lVar57 + 1;
      bVar59 = 1 < uVar54;
      uVar54 = uVar54 - 1;
      lVar55 = lVar55 + -0x20;
    } while (bVar59);
    if (0 < (int)uVar34) {
      lVar55 = 0;
      lVar57 = 0;
      do {
        pIVar13 = (pIVar26->Hooks).Data;
        if (*(int *)(pIVar13 + lVar55 + 4) == 0) {
          (**(code **)(pIVar13 + lVar55 + 0x10))(pIVar26,pIVar13 + lVar55);
          uVar34 = (pIVar26->Hooks).Size;
        }
        lVar57 = lVar57 + 1;
        lVar55 = lVar55 + 0x20;
      } while (lVar57 < (int)uVar34);
    }
  }
  pIVar53 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f6d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar47 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar47 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x1f6e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  else if ((iVar47 != 0) && (GImGui->FrameCountEnded != iVar47)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f6f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f70,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar14 = (GImGui->IO).Fonts;
  if (((pIVar14->Fonts).Size < 1) || ((pIVar14->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f71,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f72,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f73,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar62 = (GImGui->Style).Alpha;
  if ((fVar62 < 0.0) || (1.0 < fVar62)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f74,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f75,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f76,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (1 < (uint)(GImGui->Style).ColorButtonPosition) {
    __assert_fail("g.Style.ColorButtonPosition == ImGuiDir_Left || g.Style.ColorButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f77,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar55 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar55 + 0x200] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ImGuiKey_LegacyNativeKey_END && \"io.KeyMap[] contains an out of bound value (need to be 0..511, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x1f7a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x85);
  if (((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).BackendUsingLegacyKeyArrays == '\x01')
      ) && ((GImGui->IO).KeyMap[0x20c] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x1f7e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar53->SettingsLoaded == false) {
    if ((pIVar53->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x2d75,"void ImGui::UpdateSettings()");
    }
    pcVar44 = (pIVar53->IO).IniFilename;
    if (pcVar44 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar44);
    }
    pIVar53->SettingsLoaded = true;
  }
  if ((0.0 < pIVar53->SettingsDirtyTimer) &&
     (fVar62 = pIVar53->SettingsDirtyTimer - (pIVar53->IO).DeltaTime,
     pIVar53->SettingsDirtyTimer = fVar62, fVar62 <= 0.0)) {
    pcVar44 = (pIVar53->IO).IniFilename;
    if (pcVar44 == (char *)0x0) {
      (pIVar53->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar44);
    }
    pIVar53->SettingsDirtyTimer = 0.0;
  }
  fVar62 = (pIVar26->IO).DeltaTime;
  pIVar26->Time = (double)fVar62 + pIVar26->Time;
  pIVar26->WithinFrameScope = true;
  pIVar26->FrameCount = pIVar26->FrameCount + 1;
  pIVar26->TooltipOverrideCount = 0;
  pIVar26->WindowsActiveCount = 0;
  if ((pIVar26->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar41 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar41 = *piVar41 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar15 = (pIVar26->MenusIdSubmittedThisFrame).Data;
    if (puVar15 != (uint *)0x0) {
      memcpy(__dest,puVar15,(long)(pIVar26->MenusIdSubmittedThisFrame).Size << 2);
      puVar15 = (pIVar26->MenusIdSubmittedThisFrame).Data;
      if ((puVar15 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar41 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar41 = *piVar41 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar15,GImAllocatorUserData);
    }
    (pIVar26->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar26->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar62 = (pIVar26->IO).DeltaTime;
  }
  pIVar53 = GImGui;
  (pIVar26->MenusIdSubmittedThisFrame).Size = 0;
  iVar47 = pIVar26->FramerateSecPerFrameIdx;
  pIVar26->FramerateSecPerFrameAccum =
       (fVar62 - pIVar26->FramerateSecPerFrame[iVar47]) + pIVar26->FramerateSecPerFrameAccum;
  pIVar26->FramerateSecPerFrame[iVar47] = fVar62;
  iVar42 = iVar47 + (int)((ulong)((long)(iVar47 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar26->FramerateSecPerFrameIdx = iVar47 + 1 + ((iVar42 >> 6) - (iVar42 >> 0x1f)) * -0x78;
  iVar47 = 0x77;
  if (pIVar26->FramerateSecPerFrameCount < 0x77) {
    iVar47 = pIVar26->FramerateSecPerFrameCount;
  }
  pIVar26->FramerateSecPerFrameCount = iVar47 + 1;
  uVar34 = -(uint)(0.0 < pIVar26->FramerateSecPerFrameAccum);
  (pIVar26->IO).Framerate =
       (float)(~uVar34 & 0x7f7fffff |
              (uint)(1.0 / (pIVar26->FramerateSecPerFrameAccum / (float)(iVar47 + 1))) & uVar34);
  if ((pIVar53->Viewports).Size != 1) {
    __assert_fail("g.Viewports.Size == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x2eba,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar16 = *(pIVar53->Viewports).Data;
  (pIVar16->super_ImGuiViewport).Flags = 5;
  (pIVar16->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar16->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar16->super_ImGuiViewport).Size = (pIVar53->IO).DisplaySize;
  if (0 < (pIVar53->Viewports).Size) {
    lVar55 = 0;
    do {
      pIVar16 = (pIVar53->Viewports).Data[lVar55];
      IVar63 = pIVar16->BuildWorkOffsetMin;
      pIVar16->WorkOffsetMin = IVar63;
      IVar75 = pIVar16->BuildWorkOffsetMax;
      pIVar16->WorkOffsetMax = IVar75;
      (pIVar16->BuildWorkOffsetMin).x = 0.0;
      (pIVar16->BuildWorkOffsetMin).y = 0.0;
      (pIVar16->BuildWorkOffsetMax).x = 0.0;
      (pIVar16->BuildWorkOffsetMax).y = 0.0;
      IVar64 = (pIVar16->super_ImGuiViewport).Size;
      fVar62 = IVar75.x + (IVar64.x - IVar63.x);
      fVar82 = IVar75.y + (IVar64.y - IVar63.y);
      IVar64 = (pIVar16->super_ImGuiViewport).Pos;
      (pIVar16->super_ImGuiViewport).WorkPos.x = IVar64.x + IVar63.x;
      (pIVar16->super_ImGuiViewport).WorkPos.y = IVar64.y + IVar63.y;
      (pIVar16->super_ImGuiViewport).WorkSize.x = (float)(-(uint)(0.0 < fVar62) & (uint)fVar62);
      (pIVar16->super_ImGuiViewport).WorkSize.y = (float)(-(uint)(0.0 < fVar82) & (uint)fVar82);
      lVar55 = lVar55 + 1;
    } while (lVar55 < (pIVar53->Viewports).Size);
  }
  ((pIVar26->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar14 = (GImGui->IO).Fonts;
    if ((pIVar14->Fonts).Size < 1) {
      pcVar44 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_00131c6c:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.h"
                    ,0x703,pcVar44);
    }
    font = *(pIVar14->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar26->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x10de,"void ImGui::NewFrame()");
  }
  lVar55 = (long)(pIVar26->Viewports).Size;
  IVar68 = _DAT_001a76c0;
  if (0 < lVar55) {
    lVar57 = 0;
    do {
      pIVar16 = (pIVar26->Viewports).Data[lVar57];
      fVar62 = (pIVar16->super_ImGuiViewport).Pos.x;
      if (fVar62 < IVar68.x) {
        IVar68.x = fVar62;
      }
      fVar82 = (pIVar16->super_ImGuiViewport).Pos.y;
      if (fVar82 < IVar68.y) {
        IVar68.y = fVar82;
      }
      fVar62 = fVar62 + (pIVar16->super_ImGuiViewport).Size.x;
      if (IVar68.z < fVar62) {
        IVar68.z = fVar62;
      }
      fVar82 = fVar82 + (pIVar16->super_ImGuiViewport).Size.y;
      if (IVar68.w < fVar82) {
        IVar68.w = fVar82;
      }
      lVar57 = lVar57 + 1;
    } while (lVar55 != lVar57);
  }
  (pIVar26->DrawListSharedData).ClipRectFullscreen = IVar68;
  fVar62 = (pIVar26->Style).CircleTessellationMaxError;
  (pIVar26->DrawListSharedData).CurveTessellationTol = (pIVar26->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar26->DrawListSharedData,fVar62);
  bVar59 = (pIVar26->Style).AntiAliasedLines;
  uVar34 = (uint)bVar59;
  (pIVar26->DrawListSharedData).InitialFlags = (uint)bVar59;
  if (((pIVar26->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar26->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar34 = bVar59 | 2;
    (pIVar26->DrawListSharedData).InitialFlags = uVar34;
  }
  if ((pIVar26->Style).AntiAliasedFill == true) {
    uVar34 = uVar34 | 4;
    (pIVar26->DrawListSharedData).InitialFlags = uVar34;
  }
  if (((pIVar26->IO).BackendFlags & 8) != 0) {
    (pIVar26->DrawListSharedData).InitialFlags = uVar34 | 8;
  }
  if (0 < (pIVar26->Viewports).Size) {
    lVar55 = 0;
    do {
      pIVar16 = (pIVar26->Viewports).Data[lVar55];
      (pIVar16->DrawDataP).DisplaySize.x = 0.0;
      (pIVar16->DrawDataP).DisplaySize.y = 0.0;
      (pIVar16->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar16->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar16->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar16->DrawDataP).DisplayPos.x = 0.0;
      (pIVar16->DrawDataP).DisplayPos.y = 0.0;
      (pIVar16->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar16->DrawDataP).field_0x1 = 0;
      (pIVar16->DrawDataP).CmdListsCount = 0;
      (pIVar16->DrawDataP).TotalIdxCount = 0;
      (pIVar16->DrawDataP).TotalVtxCount = 0;
      lVar55 = lVar55 + 1;
    } while (lVar55 < (pIVar26->Viewports).Size);
  }
  pIVar53 = GImGui;
  if ((pIVar26->DragDropActive != false) &&
     (IVar48 = (pIVar26->DragDropPayload).SourceId, IVar48 == pIVar26->ActiveId)) {
    if (GImGui->ActiveId == IVar48) {
      GImGui->ActiveIdIsAlive = IVar48;
    }
    if (pIVar53->ActiveIdPreviousFrame == IVar48) {
      pIVar53->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar26->HoveredIdPreviousFrame == 0) {
    IVar48 = pIVar26->HoveredId;
    pIVar26->HoveredIdTimer = 0.0;
    pIVar26->HoveredIdNotActiveTimer = 0.0;
    if (IVar48 == 0) goto LAB_0012ecff;
LAB_0012ecd8:
    fVar62 = (pIVar26->IO).DeltaTime;
    pIVar26->HoveredIdTimer = pIVar26->HoveredIdTimer + fVar62;
    IVar35 = IVar48;
    if (pIVar26->ActiveId != IVar48) {
      pIVar26->HoveredIdNotActiveTimer = fVar62 + pIVar26->HoveredIdNotActiveTimer;
      IVar35 = pIVar26->ActiveId;
    }
  }
  else {
    IVar48 = pIVar26->HoveredId;
    if (IVar48 != 0) {
      if (pIVar26->ActiveId == IVar48) {
        pIVar26->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_0012ecd8;
    }
LAB_0012ecff:
    IVar48 = 0;
    IVar35 = pIVar26->ActiveId;
  }
  pIVar26->HoveredIdPreviousFrame = IVar48;
  pIVar26->HoveredIdPreviousFrameUsingMouseWheel = pIVar26->HoveredIdUsingMouseWheel;
  pIVar26->HoveredId = 0;
  pIVar26->HoveredIdAllowOverlap = false;
  pIVar26->HoveredIdUsingMouseWheel = false;
  pIVar26->HoveredIdDisabled = false;
  if (IVar35 == 0) {
    fVar62 = (pIVar26->IO).DeltaTime;
LAB_0012edb5:
    IVar35 = 0;
    bVar59 = true;
  }
  else {
    if ((pIVar26->ActiveIdIsAlive == IVar35) || (pIVar26->ActiveIdPreviousFrame != IVar35)) {
      fVar62 = (pIVar26->IO).DeltaTime;
    }
    else {
      if ((pIVar26->DebugLogFlags & 1) != 0) {
        DebugLog("NewFrame(): ClearActiveID() because it isn\'t marked alive anymore!\n");
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      IVar35 = pIVar26->ActiveId;
      fVar62 = (pIVar26->IO).DeltaTime;
      if (IVar35 == 0) goto LAB_0012edb5;
    }
    pIVar26->ActiveIdTimer = pIVar26->ActiveIdTimer + fVar62;
    bVar59 = false;
  }
  pIVar26->LastActiveIdTimer = fVar62 + pIVar26->LastActiveIdTimer;
  pIVar26->ActiveIdPreviousFrame = IVar35;
  pIVar26->ActiveIdPreviousFrameWindow = pIVar26->ActiveIdWindow;
  pIVar26->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar26->ActiveIdHasBeenEditedBefore;
  pIVar26->ActiveIdIsAlive = 0;
  pIVar26->ActiveIdHasBeenEditedThisFrame = false;
  pIVar26->ActiveIdPreviousFrameIsAlive = false;
  pIVar26->ActiveIdIsJustActivated = false;
  if ((pIVar26->TempInputId != 0) && (IVar35 != pIVar26->TempInputId)) {
    pIVar26->TempInputId = 0;
  }
  if (bVar59) {
    auVar72 = ZEXT416(0);
    *(undefined1 (*) [16])((pIVar26->ActiveIdUsingKeyInputMask).Storage + 1) = auVar72;
    pIVar26->ActiveIdUsingNavDirMask = auVar72._0_4_;
    pIVar26->ActiveIdUsingNavInputMask = auVar72._4_4_;
    (pIVar26->ActiveIdUsingKeyInputMask).Storage[0] = auVar72._8_4_;
    (pIVar26->ActiveIdUsingKeyInputMask).Storage[1] = auVar72._12_4_;
  }
  pIVar26->DragDropAcceptIdPrev = pIVar26->DragDropAcceptIdCurr;
  pIVar26->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar26->DragDropAcceptIdCurr = 0;
  pIVar26->DragDropWithinSource = false;
  pIVar26->DragDropWithinTarget = false;
  pIVar26->DragDropHoldJustPressedId = 0;
  if ((pIVar26->InputEventsTrail).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar41 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar41 = *piVar41 + 1;
    }
    __dest_00 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar17 = (pIVar26->InputEventsTrail).Data;
    if (pIVar17 != (ImGuiInputEvent *)0x0) {
      memcpy(__dest_00,pIVar17,(long)(pIVar26->InputEventsTrail).Size * 0x18);
      pIVar17 = (pIVar26->InputEventsTrail).Data;
      if ((pIVar17 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar41 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar41 = *piVar41 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
    }
    (pIVar26->InputEventsTrail).Data = __dest_00;
    (pIVar26->InputEventsTrail).Capacity = 0;
  }
  (pIVar26->InputEventsTrail).Size = 0;
  UpdateInputEvents((pIVar26->IO).ConfigInputTrickleEventQueue);
  pIVar53 = GImGui;
  cVar10 = (GImGui->IO).BackendUsingLegacyKeyArrays;
  if (cVar10 == '\0') {
    lVar55 = 0;
    do {
      if (((pIVar53->IO).KeysDown[lVar55] != false) &&
         (pIVar38 = GetKeyData((ImGuiKey)lVar55), pIVar38->Down != true)) {
        __assert_fail("(io.KeysDown[n] == false || IsKeyDown(n)) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                      ,0xf85,"void ImGui::UpdateKeyboardInputs()");
      }
      lVar55 = lVar55 + 1;
      pIVar58 = GImGui;
    } while (lVar55 != 0x200);
  }
  else {
    if (GImGui->FrameCount == 0) {
      lVar55 = 0;
      do {
        if ((GImGui->IO).KeyMap[lVar55] != -1) {
          __assert_fail("g.IO.KeyMap[n] == -1 && \"Backend is not allowed to write to io.KeyMap[0..511]!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                        ,0xf8b,"void ImGui::UpdateKeyboardInputs()");
        }
        lVar55 = lVar55 + 1;
      } while (lVar55 != 0x200);
    }
    lVar55 = 0x23e;
    do {
      uVar34 = *(uint *)(&pIVar53->Initialized + lVar55 * 4);
      if ((ulong)uVar34 != 0xffffffff) {
        if (0x1ff < uVar34) {
          __assert_fail("IsLegacyKey((ImGuiKey)io.KeyMap[n])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                        ,0xf91,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar53->IO).KeyMap[uVar34] = (int)lVar55 + -0x3e;
      }
      lVar55 = lVar55 + 1;
    } while (lVar55 != 0x2c3);
    bVar59 = cVar10 == '\x01';
    lVar55 = 0;
    do {
      lVar57 = 0;
      while (bVar29 = (pIVar53->IO).KeysDown[lVar57 + lVar55 + 0xb0c + -0xb0c], pIVar58 = pIVar53,
            !bVar59 && (bVar29 & 1U) == 0) {
        lVar6 = lVar55 + lVar57;
        lVar57 = lVar57 + 1;
        if (lVar6 == 0x1ff) goto LAB_0012f0b1;
      }
      uVar34 = (pIVar53->IO).KeyMap[lVar55 + lVar57];
      if (0x84 < uVar34 - 0x200 && uVar34 != 0xffffffff) {
        __assert_fail("io.KeyMap[n] == -1 || IsNamedKey(key)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                      ,0xf9a,"void ImGui::UpdateKeyboardInputs()");
      }
      uVar54 = lVar55 + lVar57;
      uVar56 = uVar54 & 0xffffffff;
      if (uVar34 != 0xffffffff) {
        uVar56 = (ulong)uVar34;
      }
      (pIVar53->IO).KeysData[(int)uVar56].Down = bVar29;
      if (uVar54 != uVar56) {
        (pIVar53->IO).KeysDown[(int)uVar56] =
             (pIVar53->IO).KeysDown[lVar57 + lVar55 + 0xb0c + -0xb0c];
      }
      (pIVar53->IO).BackendUsingLegacyKeyArrays = '\x01';
      lVar55 = lVar55 + lVar57 + 1;
      bVar59 = true;
    } while (uVar54 != 0x1ff);
    bVar59 = (pIVar53->IO).KeyShift;
    (pIVar53->IO).KeysData[0x281].Down = (pIVar53->IO).KeyCtrl;
    (pIVar53->IO).KeysData[0x282].Down = bVar59;
    (pIVar53->IO).KeysData[0x283].Down = (pIVar53->IO).KeyAlt;
    (pIVar53->IO).KeysData[0x284].Down = (pIVar53->IO).KeySuper;
  }
LAB_0012f0b1:
  bVar59 = (pIVar58->IO).KeyCtrl;
  bVar29 = (pIVar58->IO).KeyShift;
  uVar34 = bVar59 + 2;
  if (bVar29 == false) {
    uVar34 = (uint)bVar59;
  }
  uVar61 = uVar34 + 4;
  if ((pIVar58->IO).KeyAlt == false) {
    uVar61 = uVar34;
  }
  uVar34 = uVar61 + 8;
  if ((pIVar58->IO).KeySuper == false) {
    uVar34 = uVar61;
  }
  (pIVar53->IO).KeyMods = uVar34;
  if (((pIVar53->IO).BackendFlags & 1) == 0) {
    lVar55 = 0;
    do {
      (&(pIVar53->IO).KeysData[0x269].Down)[lVar55] = false;
      *(undefined4 *)((long)&(pIVar53->IO).KeysData[0x269].AnalogValue + lVar55) = 0;
      lVar55 = lVar55 + 0x10;
    } while (lVar55 != 0x180);
  }
  lVar55 = 0xe0c;
  do {
    fVar62 = *(float *)((long)pIVar53 + lVar55 + -4);
    *(float *)(&pIVar53->Initialized + lVar55) = fVar62;
    fVar82 = -1.0;
    if ((*(char *)((long)pIVar53 + lVar55 + -8) == '\x01') && (fVar82 = 0.0, 0.0 <= fVar62)) {
      fVar82 = fVar62 + (pIVar53->IO).DeltaTime;
    }
    *(float *)((long)pIVar53 + lVar55 + -4) = fVar82;
    lVar55 = lVar55 + 0x10;
  } while (lVar55 != 0x365c);
  (pIVar58->IO).WantSetMousePos = false;
  uVar34 = (pIVar58->IO).ConfigFlags;
  if (((uVar34 & 2) == 0) || (((pIVar58->IO).BackendFlags & 1) == 0)) {
    bVar25 = false;
  }
  else {
    bVar25 = true;
    if ((pIVar58->IO).BackendUsingLegacyNavInputArray == false) {
      lVar55 = 0;
      do {
        fVar62 = (pIVar58->IO).NavInputs[lVar55];
        if ((fVar62 != 0.0) || (NAN(fVar62))) {
          __assert_fail("io.NavInputs[n] == 0.0f && \"Backend needs to either only use io.AddKeyEvent()/io.AddKeyAnalogEvent(), either only fill legacy io.NavInputs[]. Not both!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                        ,0x27c3,"void ImGui::NavUpdate()");
        }
        lVar55 = lVar55 + 1;
      } while (lVar55 != 0x14);
      fVar62 = (pIVar58->IO).KeysData[0x26c].AnalogValue;
      (pIVar58->IO).NavInputs[0] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x26e].AnalogValue;
      (pIVar58->IO).NavInputs[1] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x26d].AnalogValue;
      (pIVar58->IO).NavInputs[3] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x26b].AnalogValue;
      (pIVar58->IO).NavInputs[2] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x271].AnalogValue;
      (pIVar58->IO).NavInputs[4] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x272].AnalogValue;
      (pIVar58->IO).NavInputs[5] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x26f].AnalogValue;
      (pIVar58->IO).NavInputs[6] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x270].AnalogValue;
      (pIVar58->IO).NavInputs[7] = fVar62;
      if (0.0 < fVar62) {
        pIVar58->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar62 = (pIVar58->IO).KeysData[0x273].AnalogValue;
      fVar82 = (pIVar58->IO).KeysData[0x274].AnalogValue;
      (pIVar58->IO).NavInputs[0xc] = fVar62;
      (pIVar58->IO).NavInputs[0xd] = fVar82;
      (pIVar58->IO).NavInputs[0xe] = fVar62;
      (pIVar58->IO).NavInputs[0xf] = fVar82;
      (pIVar58->IO).NavInputs[8] = (pIVar58->IO).KeysData[0x27b].AnalogValue;
      (pIVar58->IO).NavInputs[9] = (pIVar58->IO).KeysData[0x27c].AnalogValue;
      (pIVar58->IO).NavInputs[10] = (pIVar58->IO).KeysData[0x279].AnalogValue;
      (pIVar58->IO).NavInputs[0xb] = (pIVar58->IO).KeysData[0x27a].AnalogValue;
    }
  }
  if ((uVar34 & 1) != 0) {
    if ((pIVar58->IO).KeysData[0x20c].Down == true) {
      (pIVar58->IO).NavInputs[0] = 1.0;
      pIVar58->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar58->IO).KeysData[0x20d].Down == true) {
      (pIVar58->IO).NavInputs[2] = 1.0;
      pIVar58->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar58->IO).KeysData[0x20e].Down == true) {
      (pIVar58->IO).NavInputs[1] = 1.0;
      pIVar58->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar58->IO).KeysData[0x201].Down == true) {
      (pIVar58->IO).NavInputs[0x10] = 1.0;
      pIVar58->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar58->IO).KeysData[0x202].Down == true) {
      (pIVar58->IO).NavInputs[0x11] = 1.0;
      pIVar58->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar58->IO).KeysData[0x203].Down == true) {
      (pIVar58->IO).NavInputs[0x12] = 1.0;
      pIVar58->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar58->IO).KeysData[0x204].Down == true) {
      (pIVar58->IO).NavInputs[0x13] = 1.0;
      pIVar58->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if (bVar59 != false) {
      (pIVar58->IO).NavInputs[0xe] = 1.0;
    }
    if (bVar29 != false) {
      (pIVar58->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar1 = (pIVar58->IO).NavInputsDownDuration;
  pfVar51 = pfVar1;
  pfVar52 = (pIVar58->IO).NavInputsDownDurationPrev;
  for (lVar55 = 0x14; lVar55 != 0; lVar55 = lVar55 + -1) {
    *pfVar52 = *pfVar51;
    pfVar51 = pfVar51 + (ulong)bVar60 * -2 + 1;
    pfVar52 = pfVar52 + (ulong)bVar60 * -2 + 1;
  }
  lVar55 = 0;
  do {
    fVar62 = -1.0;
    if (0.0 < (pIVar58->IO).NavInputs[lVar55]) {
      fVar62 = 0.0;
      if (0.0 <= pfVar1[lVar55]) {
        fVar62 = pfVar1[lVar55] + (pIVar58->IO).DeltaTime;
      }
    }
    pfVar1[lVar55] = fVar62;
    lVar55 = lVar55 + 1;
  } while (lVar55 != 0x14);
  if (pIVar58->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar58->NavInitRequest = false;
  pIVar58->NavInitRequestFromMove = false;
  pIVar58->NavInitResultId = 0;
  pIVar58->NavJustMovedToId = 0;
  if (pIVar58->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar58->NavTabbingCounter = 0;
  pIVar58->NavMoveSubmitted = false;
  pIVar58->NavMoveScoringItems = false;
  if ((((pIVar58->NavMousePosDirty == true) && (pIVar58->NavIdIsAlive == true)) &&
      (pIVar58->NavDisableHighlight == false)) && (pIVar58->NavDisableMouseHover == true)) {
    bVar59 = pIVar58->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar59 = false;
  }
  pIVar58->NavMousePosDirty = false;
  IVar11 = pIVar58->NavLayer;
  if (ImGuiNavLayer_Menu < IVar11) {
    __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x2802,"void ImGui::NavUpdate()");
  }
  pIVar39 = pIVar58->NavWindow;
  pIVar45 = pIVar39;
  if (pIVar39 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar45->RootWindow == pIVar45) || ((pIVar45->Flags & 0x14000000) != 0)) {
        if (pIVar45 != pIVar39) {
          pIVar45->NavLastChildNavWindow = pIVar39;
        }
        break;
      }
      ppIVar2 = &pIVar45->ParentWindow;
      pIVar45 = *ppIVar2;
    } while (*ppIVar2 != (ImGuiWindow *)0x0);
    if ((IVar11 == ImGuiNavLayer_Main) && (pIVar39->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar39->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar53 = GImGui;
  pIVar39 = GetTopMostPopupModal();
  if (pIVar39 != (ImGuiWindow *)0x0) {
    pIVar53->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar53->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar62 = (pIVar53->IO).DeltaTime * -10.0 + pIVar53->NavWindowingHighlightAlpha;
    fVar62 = (float)(-(uint)(0.0 <= fVar62) & (uint)fVar62);
    pIVar53->NavWindowingHighlightAlpha = fVar62;
    if ((pIVar53->DimBgRatio <= 0.0) && (fVar62 <= 0.0)) {
      pIVar53->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar39 == (ImGuiWindow *)0x0) && (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar29 = (bool)(-((pIVar53->IO).NavInputsDownDuration[3] == 0.0) & 1);
    if ((pIVar53->IO).KeyCtrl != true) goto LAB_0012f473;
    bVar30 = IsKeyPressed(0x200,true);
  }
  else {
    bVar29 = false;
LAB_0012f473:
    bVar30 = false;
  }
  if (((bVar29 | bVar30) == 1) &&
     ((pIVar39 = pIVar53->NavWindow, pIVar39 != (ImGuiWindow *)0x0 ||
      (pIVar39 = FindWindowNavFocusable((pIVar53->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar39 != (ImGuiWindow *)0x0)))) {
    pIVar39 = pIVar39->RootWindow;
    pIVar53->NavWindowingTargetAnim = pIVar39;
    pIVar53->NavWindowingTarget = pIVar39;
    pIVar53->NavWindowingTimer = 0.0;
    pIVar53->NavWindowingHighlightAlpha = 0.0;
    pIVar53->NavWindowingToggleLayer = bVar29;
    pIVar53->NavInputSource = bVar30 ^ ImGuiInputSource_Gamepad;
  }
  fVar62 = (pIVar53->IO).DeltaTime + pIVar53->NavWindowingTimer;
  pIVar53->NavWindowingTimer = fVar62;
  if (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_0012f8a8:
    bVar29 = false;
    pIVar39 = (ImGuiWindow *)0x0;
  }
  else {
    IVar36 = pIVar53->NavInputSource;
    if (IVar36 != ImGuiInputSource_Gamepad) {
LAB_0012f81e:
      if (IVar36 == ImGuiInputSource_Keyboard) {
        fVar82 = (pIVar53->NavWindowingTimer + -0.2) / 0.05;
        fVar62 = 1.0;
        if (fVar82 <= 1.0) {
          fVar62 = fVar82;
        }
        fVar62 = (float)(~-(uint)(fVar82 < 0.0) & (uint)fVar62);
        uVar61 = -(uint)(fVar62 <= pIVar53->NavWindowingHighlightAlpha);
        pIVar53->NavWindowingHighlightAlpha =
             (float)(uVar61 & (uint)pIVar53->NavWindowingHighlightAlpha | ~uVar61 & (uint)fVar62);
        bVar29 = IsKeyPressed(0x200,true);
        if (bVar29) {
          NavUpdateWindowingHighlightWindow((pIVar53->IO).KeyShift - 1 | 1);
        }
        if ((pIVar53->IO).KeyCtrl == false) {
          pIVar39 = pIVar53->NavWindowingTarget;
          bVar29 = false;
          goto LAB_0012f8ad;
        }
      }
      goto LAB_0012f8a8;
    }
    fVar82 = (fVar62 + -0.2) / 0.05;
    fVar62 = 1.0;
    if (fVar82 <= 1.0) {
      fVar62 = fVar82;
    }
    fVar62 = (float)(~-(uint)(fVar82 < 0.0) & (uint)fVar62);
    uVar61 = -(uint)(fVar62 <= pIVar53->NavWindowingHighlightAlpha);
    fVar73 = (float)(uVar61 & (uint)pIVar53->NavWindowingHighlightAlpha | ~uVar61 & (uint)fVar62);
    pIVar53->NavWindowingHighlightAlpha = fVar73;
    fVar62 = GetNavInputAmount(0xc,ImGuiNavReadMode_RepeatSlow);
    fVar82 = GetNavInputAmount(0xd,ImGuiNavReadMode_RepeatSlow);
    iVar47 = (uint)(0.0 < fVar62) - (uint)(0.0 < fVar82);
    if (iVar47 != 0) {
      NavUpdateWindowingHighlightWindow(iVar47);
      pIVar53->NavWindowingHighlightAlpha = 1.0;
      fVar73 = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_0012f8a8;
      IVar36 = pIVar53->NavInputSource;
      goto LAB_0012f81e;
    }
    pbVar49 = &pIVar53->NavWindowingToggleLayer;
    *pbVar49 = (bool)(*pbVar49 & fVar73 < 1.0);
    if (*pbVar49 == false) {
      pIVar39 = pIVar53->NavWindowingTarget;
      bVar29 = false;
    }
    else {
      bVar29 = pIVar53->NavWindow != (ImGuiWindow *)0x0;
      pIVar39 = (ImGuiWindow *)0x0;
    }
    pIVar53->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_0012f8ad:
  if ((((pIVar53->IO).ConfigFlags & 1) != 0) && (bVar30 = IsKeyPressed(0x283,true), bVar30)) {
    pIVar53->NavWindowingToggleLayer = true;
    pIVar53->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar53->NavWindowingToggleLayer == true) &&
     (pIVar53->NavInputSource == ImGuiInputSource_Keyboard)) {
    if ((0 < (pIVar53->IO).InputQueueCharacters.Size) ||
       ((((pIVar53->IO).KeyCtrl != false || ((pIVar53->IO).KeyShift != false)) ||
        (bVar30 = true, (pIVar53->IO).KeySuper == true)))) {
      pIVar53->NavWindowingToggleLayer = false;
      bVar30 = false;
    }
    pfVar1 = &(GImGui->IO).KeysData[0x283].DownDurationPrev;
    if (((0.0 < *pfVar1 || *pfVar1 == 0.0) && ((GImGui->IO).KeysData[0x283].Down == false)) &&
       ((bVar30 && ((pIVar53->ActiveId == 0 || (pIVar53->ActiveIdAllowOverlap == true)))))) {
      bVar30 = IsMousePosValid(&(pIVar53->IO).MousePos);
      bVar31 = IsMousePosValid(&(pIVar53->IO).MousePosPrev);
      bVar29 = (bool)(bVar29 | bVar31 == bVar30);
    }
    if ((GImGui->IO).KeysData[0x283].Down == false) {
      pIVar53->NavWindowingToggleLayer = false;
    }
  }
  pIVar45 = pIVar53->NavWindowingTarget;
  if ((pIVar45 != (ImGuiWindow *)0x0) && ((pIVar45->Flags & 4) == 0)) {
    if (pIVar53->NavInputSource == ImGuiInputSource_Gamepad) {
      IVar64 = GetNavInputAmount2d(8,ImGuiNavReadMode_Down,0.0,0.0);
    }
    else {
      IVar64.x = 0.0;
      IVar64.y = 0.0;
      if ((pIVar53->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar53->IO).KeyShift == false)) {
        IVar64.x = (float)(int)(GImGui->IO).KeysData[0x202].Down -
                   (float)(int)(GImGui->IO).KeysData[0x201].Down;
        IVar64.y = (float)(int)(GImGui->IO).KeysData[0x204].Down -
                   (float)(int)(GImGui->IO).KeysData[0x203].Down;
      }
    }
    fVar62 = IVar64.y;
    if (((IVar64.x != 0.0) || (fVar62 != 0.0)) || (NAN(fVar62))) {
      fVar82 = (pIVar53->IO).DisplayFramebufferScale.x;
      fVar73 = (pIVar53->IO).DisplayFramebufferScale.y;
      if (fVar73 <= fVar82) {
        fVar82 = fVar73;
      }
      fVar82 = (float)(int)(fVar82 * (pIVar53->IO).DeltaTime * 800.0);
      IVar63 = pIVar45->RootWindow->Pos;
      local_48.Min.x = IVar63.x + IVar64.x * fVar82;
      local_48.Min.y = IVar63.y + fVar62 * fVar82;
      SetWindowPos(pIVar45->RootWindow,&local_48.Min,1);
      pIVar53->NavDisableMouseHover = true;
    }
  }
  if (pIVar39 != (ImGuiWindow *)0x0) {
    if ((pIVar53->NavWindow == (ImGuiWindow *)0x0) || (pIVar39 != pIVar53->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar27 = GImGui;
      pIVar27->NavMousePosDirty = true;
      pIVar27->NavDisableHighlight = false;
      pIVar27->NavDisableMouseHover = true;
      pIVar45 = pIVar39->NavLastChildNavWindow;
      if ((pIVar45 == (ImGuiWindow *)0x0) || (pIVar45->WasActive == false)) {
        pIVar45 = pIVar39;
      }
      ClosePopupsOverWindow(pIVar45,false);
      FocusWindow(pIVar45);
      if (pIVar45->NavLastIds[0] == 0) {
        NavInitWindow(pIVar45,false);
      }
      if ((pIVar45->DC).NavLayersActiveMaskNext == 2) {
        pIVar53->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar53->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar29) && (pIVar53->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar39 = pIVar53->NavWindow;
    pIVar45 = pIVar39;
    do {
      window_00 = pIVar45;
      if ((window_00->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window_00->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar45 = window_00->ParentWindow;
    } while ((window_00->Flags & 0x15000000U) == 0x1000000);
    if (window_00 != pIVar39) {
      FocusWindow(window_00);
      window_00->NavLastChildNavWindow = pIVar39;
      pIVar39 = pIVar53->NavWindow;
    }
    IVar11 = pIVar53->NavLayer;
    if (((pIVar39->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar11 == ImGuiNavLayer_Main) goto LAB_0012fc65;
    }
    else if (IVar11 == ImGuiNavLayer_Main) {
      pIVar39->NavLastIds[1] = 0;
      layer = ImGuiNavLayer_Menu;
    }
    else {
      layer = IVar11 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
    pIVar53 = GImGui;
    pIVar53->NavMousePosDirty = true;
    pIVar53->NavDisableHighlight = false;
    pIVar53->NavDisableMouseHover = true;
  }
LAB_0012fc65:
  if (((uVar34 & 1) == 0 && !bVar25) || (pIVar58->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar58->IO).NavActive = false;
LAB_0012fcac:
    bVar29 = pIVar58->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar29 = (pIVar58->NavWindow->Flags & 0x40000U) == 0;
    (pIVar58->IO).NavActive = bVar29;
    if (((!bVar29) || (pIVar58->NavId == 0)) ||
       (bVar29 = true, pIVar58->NavDisableHighlight != false)) goto LAB_0012fcac;
  }
  (pIVar58->IO).NavVisible = bVar29;
  pIVar53 = GImGui;
  fVar62 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar62 == 0.0) && (!NAN(fVar62))) {
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] ImGuiNavInput_Cancel\n");
    }
    if (pIVar53->ActiveId == 0) {
      if (pIVar53->NavLayer == ImGuiNavLayer_Main) {
        pIVar39 = pIVar53->NavWindow;
        if (((pIVar39 == (ImGuiWindow *)0x0) || (pIVar39 == pIVar39->RootWindow)) ||
           (((pIVar39->Flags & 0x4000000) != 0 ||
            (pIVar45 = pIVar39->ParentWindow, pIVar45 == (ImGuiWindow *)0x0)))) {
          iVar47 = (pIVar53->OpenPopupStack).Size;
          if (((long)iVar47 < 1) ||
             ((((pIVar53->OpenPopupStack).Data[(long)iVar47 + -1].Window)->Flags & 0x8000000) != 0))
          {
            if ((pIVar39 != (ImGuiWindow *)0x0) && ((pIVar39->Flags & 0x5000000U) != 0x1000000)) {
              pIVar39->NavLastIds[0] = 0;
            }
            pIVar53->NavId = 0;
            pIVar53->NavFocusScopeId = 0;
          }
          else {
            ClosePopupToLevel(iVar47 + -1,true);
          }
          goto LAB_0012fe3c;
        }
        if (pIVar39->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                        ,0x2984,"void ImGui::NavUpdateCancelRequest()");
        }
        IVar64 = pIVar39->Size;
        fVar73 = (pIVar39->Pos).x;
        fVar79 = (pIVar39->Pos).y;
        FocusWindow(pIVar45);
        IVar63 = (pIVar45->DC).CursorStartPos;
        fVar62 = IVar63.x;
        local_48.Min.x = fVar73 - fVar62;
        fVar82 = IVar63.y;
        local_48.Min.y = fVar79 - fVar82;
        local_48.Max.x = (IVar64.x + fVar73) - fVar62;
        local_48.Max.y = (IVar64.y + fVar79) - fVar82;
        SetNavID(pIVar39->ChildId,ImGuiNavLayer_Main,0,&local_48);
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
      }
      pIVar53 = GImGui;
      pIVar53->NavMousePosDirty = true;
      pIVar53->NavDisableHighlight = false;
      pIVar53->NavDisableMouseHover = true;
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
LAB_0012fe3c:
  pIVar58->NavActivateId = 0;
  pIVar58->NavActivateDownId = 0;
  pIVar58->NavActivatePressedId = 0;
  pIVar58->NavActivateInputId = 0;
  pIVar58->NavActivateFlags = 0;
  IVar48 = pIVar58->NavId;
  IVar35 = 0;
  if (((IVar48 == 0) || (pIVar58->NavDisableHighlight != false)) ||
     (pIVar58->NavWindowingTarget != (ImGuiWindow *)0x0)) {
    IVar50 = 0;
LAB_0012fe79:
    if ((pIVar58->NavWindow != (ImGuiWindow *)0x0) && ((pIVar58->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar58->NavDisableHighlight = true;
    }
    if (IVar35 != IVar50 && IVar50 != 0) {
      __assert_fail("g.NavActivateDownId == g.NavActivateId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x282f,"void ImGui::NavUpdate()");
    }
  }
  else if (pIVar58->NavWindow != (ImGuiWindow *)0x0) {
    IVar50 = 0;
    if ((pIVar58->NavWindow->Flags & 0x40000) != 0) goto LAB_0012fe79;
    fVar62 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar62) {
      bVar29 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar29 = false;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar30 = false;
    }
    else {
      bVar30 = (GImGui->IO).NavInputsDownDuration[2] == 0.0;
    }
    IVar12 = pIVar58->ActiveId;
    if (bVar29 && IVar12 == 0) {
      pIVar58->NavActivateId = IVar48;
      pIVar58->NavActivateFlags = 2;
      IVar50 = IVar48;
LAB_00131a38:
      if (bVar30) {
        pIVar58->NavActivateInputId = IVar48;
        pIVar58->NavActivateFlags = 1;
      }
      IVar35 = 0;
      if (0.0 < fVar62) {
        pIVar58->NavActivateDownId = IVar48;
        IVar35 = IVar48;
      }
    }
    else {
      if (IVar12 == 0) {
        IVar50 = 0;
        goto LAB_00131a38;
      }
      if ((bool)(bVar30 & IVar12 == IVar48)) {
        pIVar58->NavActivateInputId = IVar48;
        pIVar58->NavActivateFlags = 1;
      }
      IVar50 = 0;
      IVar35 = 0;
      if (IVar12 == IVar48 && 0.0 < fVar62) {
        pIVar58->NavActivateDownId = IVar48;
        IVar35 = IVar48;
      }
      bVar29 = (bool)(bVar29 & IVar12 == IVar48);
    }
    if (bVar29) {
      pIVar58->NavActivatePressedId = IVar48;
    }
    goto LAB_0012fe79;
  }
  IVar48 = pIVar58->NavNextActivateId;
  if (IVar48 != 0) {
    if ((pIVar58->NavNextActivateFlags & 1U) == 0) {
      pIVar58->NavActivatePressedId = IVar48;
      pIVar58->NavActivateDownId = IVar48;
      pIVar58->NavActivateId = IVar48;
    }
    else {
      pIVar58->NavActivateInputId = IVar48;
    }
    pIVar58->NavActivateFlags = pIVar58->NavNextActivateFlags;
  }
  pIVar58->NavNextActivateId = 0;
  pIVar53 = GImGui;
  pIVar39 = GImGui->NavWindow;
  if ((pIVar39 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    if ((GImGui->NavMoveDir == -1) || (GImGui->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x2892,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    if ((GImGui->NavMoveFlags & 0x80) == 0) {
      __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x2893,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    fVar62 = 0.0;
    if ((GImGui->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavMoveRequestForward %d\n");
      IVar37 = pIVar53->NavMoveDir;
LAB_001300d9:
      pIVar27 = GImGui;
      fVar62 = 0.0;
      if ((((IVar37 == -1) && (((pIVar53->IO).ConfigFlags & 1U) != 0)) &&
          (pIVar45 = GImGui->NavWindow, (pIVar45->Flags & 0x40000) == 0)) &&
         (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
        bVar29 = false;
        bVar30 = false;
        if ((GImGui->IO).KeysData[0x205].Down == true) {
          bVar30 = ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x20) == 0;
        }
        if ((GImGui->IO).KeysData[0x206].Down == true) {
          bVar29 = ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x40) == 0;
        }
        bVar31 = IsKeyPressed(0x207,true);
        if (bVar31) {
          bVar31 = ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x80) == 0;
        }
        else {
          bVar31 = false;
        }
        bVar32 = IsKeyPressed(0x208,true);
        if (bVar32) {
          bVar32 = ((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 0x100) == 0;
        }
        else {
          bVar32 = false;
        }
        fVar62 = 0.0;
        if ((bVar30 != bVar29) || (bVar31 != bVar32)) {
          if (pIVar27->NavLayer != ImGuiNavLayer_Main) {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
          if (((pIVar45->DC).NavLayersActiveMask == 0) && ((pIVar45->DC).NavHasScroll == true)) {
            bVar29 = IsKeyPressed(0x205,true);
            if (bVar29) {
              fVar62 = (pIVar45->Scroll).y -
                       ((pIVar45->InnerRect).Max.y - (pIVar45->InnerRect).Min.y);
            }
            else {
              bVar29 = IsKeyPressed(0x206,true);
              if (!bVar29) {
                fVar62 = 0.0;
                if (bVar31 == false) {
                  if (bVar32 == false) goto LAB_001301ae;
                  (pIVar45->ScrollTarget).y = (pIVar45->ScrollMax).y;
                }
                else {
                  (pIVar45->ScrollTarget).y = 0.0;
                }
                (pIVar45->ScrollTargetCenterRatio).y = 0.0;
                (pIVar45->ScrollTargetEdgeSnapDist).y = 0.0;
                goto LAB_001301ae;
              }
              fVar62 = ((pIVar45->InnerRect).Max.y - (pIVar45->InnerRect).Min.y) +
                       (pIVar45->Scroll).y;
            }
            (pIVar45->ScrollTarget).y = fVar62;
            (pIVar45->ScrollTargetCenterRatio).y = 0.0;
            (pIVar45->ScrollTargetEdgeSnapDist).y = 0.0;
            goto LAB_001301ab;
          }
          IVar11 = pIVar27->NavLayer;
          pIVar46 = pIVar45->NavRectRel + IVar11;
          fVar62 = GImGui->FontBaseSize * pIVar45->FontWindowScale;
          if (pIVar45->ParentWindow != (ImGuiWindow *)0x0) {
            fVar62 = fVar62 * pIVar45->ParentWindow->FontWindowScale;
          }
          fVar62 = (pIVar45->NavRectRel[IVar11].Max.y - pIVar45->NavRectRel[IVar11].Min.y) +
                   (((pIVar45->InnerRect).Max.y - (pIVar45->InnerRect).Min.y) - fVar62);
          fVar62 = (float)(~-(uint)(fVar62 <= 0.0) & (uint)fVar62);
          bVar29 = IsKeyPressed(0x205,true);
          if (bVar29) {
            fVar62 = -fVar62;
            IVar37 = 2;
            IVar43 = 3;
          }
          else {
            bVar29 = IsKeyPressed(0x206,true);
            if (!bVar29) {
              if (bVar31 != false) {
                pIVar45->NavRectRel[IVar11].Max.y = 0.0;
                pIVar45->NavRectRel[IVar11].Min.y = 0.0;
                fVar62 = (pIVar46->Min).x;
                pIVar3 = &pIVar45->NavRectRel[IVar11].Max;
                if (pIVar3->x <= fVar62 && fVar62 != pIVar3->x) {
                  pIVar45->NavRectRel[IVar11].Max.x = 0.0;
                  (pIVar46->Min).x = 0.0;
                }
                pIVar27->NavMoveDir = 3;
                pIVar27->NavMoveFlags = 0x50;
                goto LAB_001301ab;
              }
              fVar62 = 0.0;
              if (bVar32 != false) {
                fVar82 = (pIVar45->ContentSize).y;
                pIVar45->NavRectRel[IVar11].Max.y = fVar82;
                pIVar45->NavRectRel[IVar11].Min.y = fVar82;
                fVar82 = (pIVar46->Min).x;
                pIVar3 = &pIVar45->NavRectRel[IVar11].Max;
                if (pIVar3->x <= fVar82 && fVar82 != pIVar3->x) {
                  pIVar45->NavRectRel[IVar11].Max.x = 0.0;
                  (pIVar46->Min).x = 0.0;
                }
                pIVar27->NavMoveDir = 2;
                pIVar27->NavMoveFlags = 0x50;
              }
              goto LAB_001301ae;
            }
            IVar37 = 3;
            IVar43 = 2;
          }
          pIVar27->NavMoveDir = IVar43;
          pIVar27->NavMoveClipDir = IVar37;
          pIVar27->NavMoveFlags = 0x30;
          if ((fVar62 != 0.0) || (NAN(fVar62))) {
            IVar64 = (pIVar39->InnerRect).Max;
            (pIVar53->NavScoringNoClipRect).Min = (pIVar39->InnerRect).Min;
            (pIVar53->NavScoringNoClipRect).Max = IVar64;
            (pIVar53->NavScoringNoClipRect).Min.y = (pIVar53->NavScoringNoClipRect).Min.y + fVar62;
            (pIVar53->NavScoringNoClipRect).Max.y = (pIVar53->NavScoringNoClipRect).Max.y + fVar62;
          }
        }
      }
    }
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar53->NavMoveFlags = 0;
    pIVar53->NavMoveScrollFlags = 0;
    if (pIVar39 != (ImGuiWindow *)0x0) {
      IVar37 = -1;
      if ((pIVar53->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar39->Flags & 0x40000) == 0))
      {
        uVar61 = pIVar53->ActiveIdUsingNavDirMask;
        if (((uVar61 & 1) == 0) &&
           ((fVar62 = GetNavInputAmount(4,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
            (fVar62 = GetNavInputAmount(0x10,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
          pIVar53->NavMoveDir = 0;
          IVar37 = 0;
        }
        if (((uVar61 & 2) == 0) &&
           ((fVar62 = GetNavInputAmount(5,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
            (fVar62 = GetNavInputAmount(0x11,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
          pIVar53->NavMoveDir = 1;
          IVar37 = 1;
        }
        if (((uVar61 & 4) == 0) &&
           ((fVar62 = GetNavInputAmount(6,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
            (fVar62 = GetNavInputAmount(0x12,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
          pIVar53->NavMoveDir = 2;
          IVar37 = 2;
        }
        if (((uVar61 & 8) == 0) &&
           ((fVar62 = GetNavInputAmount(7,ImGuiNavReadMode_Repeat), 0.0 < fVar62 ||
            (fVar62 = GetNavInputAmount(0x13,ImGuiNavReadMode_Repeat), 0.0 < fVar62)))) {
          pIVar53->NavMoveDir = 3;
          IVar37 = 3;
        }
      }
      pIVar53->NavMoveClipDir = IVar37;
      (pIVar53->NavScoringNoClipRect).Min.x = 3.4028235e+38;
      (pIVar53->NavScoringNoClipRect).Min.y = 3.4028235e+38;
      (pIVar53->NavScoringNoClipRect).Max.x = -3.4028235e+38;
      (pIVar53->NavScoringNoClipRect).Max.y = -3.4028235e+38;
      goto LAB_001300d9;
    }
    pIVar53->NavMoveClipDir = -1;
    (pIVar53->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar53->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar53->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar53->NavScoringNoClipRect).Max.y = -3.4028235e+38;
LAB_001301ab:
    fVar62 = 0.0;
  }
LAB_001301ae:
  pIVar53->NavMoveForwardToNextFrame = false;
  if (pIVar53->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar53->NavMoveDir,pIVar53->NavMoveClipDir,pIVar53->NavMoveFlags,
               pIVar53->NavMoveScrollFlags);
  }
  bVar60 = pIVar53->NavMoveSubmitted;
  if (((bool)bVar60 == true) && (pIVar53->NavId == 0)) {
    if ((pIVar53->DebugLogFlags & 8) != 0) {
      if (pIVar39 == (ImGuiWindow *)0x0) {
        pcVar44 = "<NULL>";
      }
      else {
        pcVar44 = pIVar39->Name;
      }
      DebugLog("[nav] NavInitRequest: from move, window \"%s\", layer=%d\n",pcVar44,
               (ulong)pIVar53->NavLayer);
      bVar60 = pIVar53->NavMoveSubmitted;
    }
    pIVar53->NavInitRequest = true;
    pIVar53->NavInitRequestFromMove = true;
    pIVar53->NavInitResultId = 0;
    pIVar53->NavDisableHighlight = false;
  }
  if ((((bVar60 & 1) == 0) || (pIVar53->NavInputSource != ImGuiInputSource_Gamepad)) ||
     (pIVar53->NavLayer != ImGuiNavLayer_Main || pIVar39 == (ImGuiWindow *)0x0)) {
    if (pIVar39 != (ImGuiWindow *)0x0) goto LAB_00130409;
    IVar63.x = 0.0;
    IVar63.y = 0.0;
    IVar75.x = 0.0;
    IVar75.y = 0.0;
  }
  else {
    iVar83 = -(uint)((pIVar53->NavMoveFlags & 5U) == 0);
    register0x00001284 = -(uint)((pIVar53->NavMoveFlags & 10U) == 0);
    auVar76._8_4_ = 0xffffffff;
    auVar76._12_4_ = 0xffffffff;
    auVar72._4_4_ = register0x00001284;
    auVar72._0_4_ = register0x00001284;
    auVar72._8_4_ = register0x00001284;
    auVar72._12_4_ = register0x00001284;
    if (((auVar72 | auVar76) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      IVar64 = (pIVar39->DC).CursorStartPos;
      fVar82 = IVar64.x;
      auVar69._0_4_ = ((pIVar39->InnerRect).Min.x + -1.0) - fVar82;
      fVar73 = IVar64.y;
      auVar69._4_4_ = ((pIVar39->InnerRect).Min.y + -1.0) - fVar73;
      auVar69._8_4_ = ((pIVar39->InnerRect).Max.x + 1.0) - fVar82;
      auVar69._12_4_ = ((pIVar39->InnerRect).Max.y + 1.0) - fVar73;
      if (((pIVar39->NavRectRel[0].Min.x < auVar69._0_4_) ||
          (pIVar39->NavRectRel[0].Min.y < auVar69._4_4_)) ||
         ((auVar69._8_4_ < pIVar39->NavRectRel[0].Max.x ||
          (auVar69._12_4_ < pIVar39->NavRectRel[0].Max.y)))) {
        auVar77._0_8_ = CONCAT44(register0x00001284,iVar83);
        auVar77._8_4_ = iVar83;
        auVar77._12_4_ = register0x00001284;
        auVar71._0_4_ = auVar69._8_4_ - auVar69._0_4_;
        auVar71._4_4_ = auVar69._12_4_ - auVar69._4_4_;
        fVar82 = GImGui->FontBaseSize * pIVar39->FontWindowScale;
        if (pIVar39->ParentWindow != (ImGuiWindow *)0x0) {
          fVar82 = fVar82 * pIVar39->ParentWindow->FontWindowScale;
        }
        auVar80._0_4_ = fVar82 * 0.5;
        auVar80._4_4_ = auVar80._0_4_;
        auVar80._8_4_ = auVar80._0_4_;
        auVar80._12_4_ = auVar80._0_4_;
        auVar71._8_4_ = auVar71._0_4_;
        auVar71._12_4_ = auVar71._4_4_;
        auVar72 = minps(auVar71,auVar80);
        auVar23._4_8_ = auVar69._8_8_;
        auVar23._0_4_ = auVar69._4_4_ - auVar72._4_4_;
        auVar70._0_8_ = auVar23._0_8_ << 0x20;
        auVar70._8_4_ = auVar69._8_4_ - auVar72._8_4_;
        auVar70._12_4_ = auVar69._12_4_ - auVar72._12_4_;
        local_48.Min = (ImVec2)(~auVar77._0_8_ & 0xff7fffffff7fffff |
                               CONCAT44(auVar69._4_4_ + auVar72._4_4_,auVar69._0_4_ + auVar72._0_4_)
                               & auVar77._0_8_);
        local_48.Max = (ImVec2)(~auVar77._8_8_ & 0x7f7fffff7f7fffff | auVar70._8_8_ & auVar77._8_8_)
        ;
        ImRect::ClipWithFull(pIVar39->NavRectRel,&local_48);
        pIVar53->NavId = 0;
        pIVar53->NavFocusScopeId = 0;
      }
    }
LAB_00130409:
    IVar11 = pIVar53->NavLayer;
    fVar82 = pIVar39->NavRectRel[IVar11].Min.x;
    fVar73 = pIVar39->NavRectRel[IVar11].Max.x;
    if (fVar73 < fVar82) {
LAB_00130442:
      fVar74 = 0.0;
      fVar73 = 0.0;
      fVar79 = 0.0;
      fVar82 = 0.0;
    }
    else {
      fVar79 = pIVar39->NavRectRel[IVar11].Min.y;
      fVar74 = pIVar39->NavRectRel[IVar11].Max.y;
      if (fVar74 < fVar79) goto LAB_00130442;
    }
    fVar9 = (pIVar39->DC).CursorStartPos.y;
    fVar79 = fVar79 + fVar9 + fVar62;
    fVar62 = fVar74 + fVar9 + fVar62;
    if (fVar62 < fVar79) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x28ec,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    fVar74 = (pIVar39->DC).CursorStartPos.x;
    fVar73 = fVar73 + fVar74;
    fVar82 = fVar82 + fVar74 + 1.0;
    if (fVar73 <= fVar82) {
      fVar82 = fVar73;
    }
    IVar75.y = fVar79;
    IVar75.x = fVar82;
    IVar63.y = fVar62;
    IVar63.x = fVar82;
  }
  (pIVar53->NavScoringRect).Min = IVar75;
  (pIVar53->NavScoringRect).Max = IVar63;
  if (IVar75.x < (pIVar53->NavScoringNoClipRect).Min.x) {
    (pIVar53->NavScoringNoClipRect).Min.x = IVar75.x;
  }
  if (IVar75.y < (pIVar53->NavScoringNoClipRect).Min.y) {
    (pIVar53->NavScoringNoClipRect).Min.y = IVar75.y;
  }
  pIVar3 = &(pIVar53->NavScoringNoClipRect).Max;
  fVar62 = IVar63.x;
  if (pIVar3->x <= fVar62 && fVar62 != pIVar3->x) {
    (pIVar53->NavScoringNoClipRect).Max.x = fVar62;
  }
  fVar62 = IVar63.y;
  pfVar1 = &(pIVar53->NavScoringNoClipRect).Max.y;
  if (*pfVar1 <= fVar62 && fVar62 != *pfVar1) {
    (pIVar53->NavScoringNoClipRect).Max.y = fVar62;
  }
  pIVar53 = GImGui;
  if (pIVar58->NavMoveDir == -1) {
    if (GImGui->NavMoveDir != -1) {
      __assert_fail("g.NavMoveDir == ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x28f8,"void ImGui::NavUpdateCreateTabbingRequest()");
    }
    pIVar39 = GImGui->NavWindow;
    if (((pIVar39 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((((pIVar39->Flags & 0x40000) == 0 &&
         (((bVar29 = IsKeyPressed(0x200,true), bVar29 &&
           (((GImGui->ActiveIdUsingKeyInputMask).Storage[0] & 1) == 0)) &&
          ((pIVar53->IO).KeyCtrl == false)))) && ((pIVar53->IO).KeyAlt == false)))) {
      if ((pIVar53->IO).KeyShift == false) {
        uVar61 = (uint)(pIVar53->ActiveId != 0);
        IVar37 = 3;
      }
      else {
        IVar37 = 2;
        uVar61 = 0xffffffff;
      }
      scroll_flags = 3;
      if (pIVar39->Appearing != false) {
        scroll_flags = 0x21;
      }
      pIVar53->NavTabbingDir = uVar61;
      NavMoveRequestSubmit(-1,IVar37,0x400,scroll_flags);
      pIVar53->NavTabbingCounter = -1;
    }
  }
  pIVar53 = GImGui;
  if (GImGui->NavMoveScoringItems == false) {
    pbVar49 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar49;
    if (*pbVar49 != false) goto LAB_00130548;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00130548:
    if (pIVar53->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                    ,0x2742,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar58->NavIdIsAlive = false;
  pIVar39 = pIVar58->NavWindow;
  if (((pIVar39 != (ImGuiWindow *)0x0) && ((pIVar39->Flags & 0x40000) == 0)) &&
     (pIVar58->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar62 = pIVar53->FontBaseSize * pIVar39->FontWindowScale;
    if (pIVar39->ParentWindow != (ImGuiWindow *)0x0) {
      fVar62 = fVar62 * pIVar39->ParentWindow->FontWindowScale;
    }
    fVar62 = (float)(int)(fVar62 * 100.0 * (pIVar58->IO).DeltaTime + 0.5);
    if (((pIVar39->DC).NavLayersActiveMask == 0) &&
       (uVar61 = pIVar58->NavMoveDir, (uVar61 != 0xffffffff & (pIVar39->DC).NavHasScroll) == 1)) {
      if (uVar61 < 2) {
        (pIVar39->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_001a83d0 + (ulong)(uVar61 == 0) * 4) * fVar62 +
                         (pIVar39->Scroll).x);
        (pIVar39->ScrollTargetCenterRatio).x = 0.0;
        (pIVar39->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar61 & 0xfffffffe) == 2) {
        (pIVar39->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_001a83d0 + (ulong)(uVar61 == 2) * 4) * fVar62 +
                         (pIVar39->Scroll).y);
        (pIVar39->ScrollTargetCenterRatio).y = 0.0;
        (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar64 = GetNavInputAmount2d(8,ImGuiNavReadMode_Down,0.1,10.0);
    fVar82 = IVar64.x;
    fVar73 = IVar64.y;
    if (((fVar82 != 0.0) || (NAN(fVar82))) && (pIVar39->ScrollbarX == true)) {
      (pIVar39->ScrollTarget).x = (float)(int)(fVar82 * fVar62 + (pIVar39->Scroll).x);
      (pIVar39->ScrollTargetCenterRatio).x = 0.0;
      (pIVar39->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar73 != 0.0) || (NAN(fVar73))) {
      (pIVar39->ScrollTarget).y = (float)(int)(fVar73 * fVar62 + (pIVar39->Scroll).y);
      (pIVar39->ScrollTargetCenterRatio).y = 0.0;
      (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar34 & 1) == 0 && !bVar25) {
    pIVar58->NavDisableHighlight = true;
    pIVar58->NavDisableMouseHover = false;
  }
  else if (((bVar59) && (((pIVar58->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar58->IO).BackendFlags & 4) != 0)) {
    IVar64 = NavCalcPreferredRefPos();
    (pIVar58->IO).MousePosPrev = IVar64;
    (pIVar58->IO).MousePos = IVar64;
    (pIVar58->IO).WantSetMousePos = true;
    pIVar53 = GImGui;
  }
  pIVar58->NavScoringDebugCount = 0;
  pIVar3 = &(pIVar53->IO).MousePos;
  bVar59 = IsMousePosValid(pIVar3);
  if (bVar59) {
    IVar64 = (pIVar53->IO).MousePos;
    fVar62 = IVar64.x;
    fVar82 = IVar64.y;
    IVar65.x = (float)(int)((int)fVar62 - (uint)((float)(int)fVar62 != fVar62 && fVar62 < 0.0));
    IVar65.y = (float)(int)((int)fVar82 - (uint)((float)(int)fVar82 != fVar82 && fVar82 < 0.0));
    pIVar53->MouseLastValidPos = IVar65;
    (pIVar53->IO).MousePos = IVar65;
  }
  bVar59 = IsMousePosValid(pIVar3);
  if ((bVar59) && (bVar59 = IsMousePosValid(&(pIVar53->IO).MousePosPrev), bVar59)) {
    IVar64 = (pIVar53->IO).MousePos;
    IVar63 = (pIVar53->IO).MousePosPrev;
    IVar66.x = IVar64.x - IVar63.x;
    IVar66.y = IVar64.y - IVar63.y;
    (pIVar53->IO).MouseDelta = IVar66;
    if ((((IVar66.x != 0.0) || (NAN(IVar66.x))) || (IVar66.y != 0.0)) || (NAN(IVar66.y))) {
      pIVar53->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar53->IO).MouseDelta.x = 0.0;
    (pIVar53->IO).MouseDelta.y = 0.0;
  }
  (pIVar53->IO).MousePosPrev = (pIVar53->IO).MousePos;
  lVar55 = 0;
  do {
    if ((pIVar53->IO).MouseDown[lVar55] == true) {
      fVar62 = (pIVar53->IO).MouseDownDuration[lVar55];
      pbVar49 = (pIVar53->IO).MouseClicked + lVar55;
      *pbVar49 = fVar62 < 0.0;
      (pIVar53->IO).MouseClickedCount[lVar55] = 0;
      pbVar49[0x1e] = false;
      (pIVar53->IO).MouseDownDurationPrev[lVar55] = fVar62;
      if (0.0 <= fVar62) {
        (pIVar53->IO).MouseDownDuration[lVar55] = fVar62 + (pIVar53->IO).DeltaTime;
        bVar59 = IsMousePosValid(pIVar3);
        fVar62 = 0.0;
        if (bVar59) {
          fVar62 = (pIVar53->IO).MousePos.x - (pIVar53->IO).MouseClickedPos[lVar55].x;
          fVar82 = (pIVar53->IO).MousePos.y - (pIVar53->IO).MouseClickedPos[lVar55].y;
          fVar62 = fVar62 * fVar62 + fVar82 * fVar82;
        }
        fVar82 = (pIVar53->IO).MouseDragMaxDistanceSqr[lVar55];
        uVar34 = -(uint)(fVar62 <= fVar82);
        (pIVar53->IO).MouseDragMaxDistanceSqr[lVar55] =
             (float)(~uVar34 & (uint)fVar62 | (uint)fVar82 & uVar34);
        IVar33 = (pIVar53->IO).MouseClickedCount[lVar55];
      }
      else {
        (pIVar53->IO).MouseDownDuration[lVar55] = 0.0;
        if ((pIVar53->IO).MouseDoubleClickTime <=
            (float)(pIVar53->Time - (pIVar53->IO).MouseClickedTime[lVar55])) {
LAB_001309c7:
          (pIVar53->IO).MouseClickedLastCount[lVar55] = 1;
        }
        else {
          bVar59 = IsMousePosValid(pIVar3);
          fVar62 = 0.0;
          fVar82 = 0.0;
          if (bVar59) {
            IVar64 = (pIVar53->IO).MousePos;
            IVar63 = (pIVar53->IO).MouseClickedPos[lVar55];
            fVar62 = IVar64.x - IVar63.x;
            fVar82 = IVar64.y - IVar63.y;
          }
          fVar73 = (pIVar53->IO).MouseDoubleClickMaxDist;
          if (fVar73 * fVar73 <= fVar62 * fVar62 + fVar82 * fVar82) goto LAB_001309c7;
          pIVar8 = (pIVar53->IO).MouseClickedLastCount + lVar55;
          *pIVar8 = *pIVar8 + 1;
        }
        (pIVar53->IO).MouseClickedTime[lVar55] = pIVar53->Time;
        (pIVar53->IO).MouseClickedPos[lVar55] = (pIVar53->IO).MousePos;
        IVar33 = (pIVar53->IO).MouseClickedLastCount[lVar55];
        (pIVar53->IO).MouseClickedCount[lVar55] = IVar33;
        (pIVar53->IO).MouseDragMaxDistanceSqr[lVar55] = 0.0;
      }
    }
    else {
      (pIVar53->IO).MouseClicked[lVar55] = false;
      (pIVar53->IO).MouseClickedCount[lVar55] = 0;
      fVar62 = (pIVar53->IO).MouseDownDuration[lVar55];
      (pIVar53->IO).MouseReleased[lVar55] = 0.0 <= fVar62;
      pbVar49 = (pIVar53->IO).MouseClicked + lVar55;
      (pIVar53->IO).MouseDownDurationPrev[lVar55] = fVar62;
      (pIVar53->IO).MouseDownDuration[lVar55] = -1.0;
      IVar33 = 0;
    }
    (pIVar53->IO).MouseDoubleClicked[lVar55] = IVar33 == 2;
    if (*pbVar49 == true) {
      pIVar53->NavDisableMouseHover = false;
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar39 = GetTopMostPopupModal();
  if ((pIVar39 != (ImGuiWindow *)0x0) ||
     ((pIVar26->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar26->NavWindowingHighlightAlpha)))) {
    fVar62 = (pIVar26->IO).DeltaTime * 6.0 + pIVar26->DimBgRatio;
    if (1.0 <= fVar62) {
      fVar62 = 1.0;
    }
    pIVar26->DimBgRatio = fVar62;
  }
  else {
    fVar62 = (pIVar26->IO).DeltaTime * -10.0 + pIVar26->DimBgRatio;
    pIVar26->DimBgRatio = (float)(-(uint)(0.0 <= fVar62) & (uint)fVar62);
  }
  pIVar26->MouseCursor = 0;
  pIVar26->WantTextInputNextFrame = -1;
  pIVar26->WantCaptureMouseNextFrame = -1;
  pIVar26->WantCaptureKeyboardNextFrame = -1;
  uVar28 = *(undefined3 *)&(pIVar26->PlatformImeData).field_0x1;
  fVar62 = (pIVar26->PlatformImeData).InputPos.x;
  uVar24 = *(undefined8 *)&(pIVar26->PlatformImeData).InputPos.y;
  (pIVar26->PlatformImeDataPrev).WantVisible = (pIVar26->PlatformImeData).WantVisible;
  *(undefined3 *)&(pIVar26->PlatformImeDataPrev).field_0x1 = uVar28;
  (pIVar26->PlatformImeDataPrev).InputPos.x = fVar62;
  *(undefined8 *)&(pIVar26->PlatformImeDataPrev).InputPos.y = uVar24;
  (pIVar26->PlatformImeData).WantVisible = false;
  pIVar53 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar59 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar59) &&
        (fVar82 = (pIVar53->IO).MousePos.x - (pIVar53->WheelingWindowRefMousePos).x,
        fVar73 = (pIVar53->IO).MousePos.y - (pIVar53->WheelingWindowRefMousePos).y,
        fVar62 = (pIVar53->IO).MouseDragThreshold,
        fVar62 * fVar62 < fVar82 * fVar82 + fVar73 * fVar73)) ||
       (pIVar53->WheelingWindowTimer <= 0.0)) {
      pIVar53->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar53->WheelingWindowTimer = 0.0;
    }
  }
  pIVar58 = GImGui;
  fVar62 = (pIVar53->IO).MouseWheel;
  fVar82 = (pIVar53->IO).MouseWheelH;
  if ((((((fVar82 != 0.0) || (fVar62 != 0.0)) || (NAN(fVar62))) &&
       (((pIVar53->ActiveId == 0 || (pIVar53->ActiveIdUsingMouseWheel == false)) &&
        ((pIVar53->HoveredIdPreviousFrame == 0 ||
         (pIVar53->HoveredIdPreviousFrameUsingMouseWheel == false)))))) &&
      ((pIVar39 = pIVar53->WheelingWindow, pIVar39 != (ImGuiWindow *)0x0 ||
       (pIVar39 = pIVar53->HoveredWindow, pIVar39 != (ImGuiWindow *)0x0)))) &&
     (pIVar39->Collapsed == false)) {
    bVar59 = (pIVar53->IO).KeyCtrl;
    fVar73 = fVar82;
    if ((fVar62 != 0.0) || (NAN(fVar62))) {
      if ((bVar59 & 1U) == 0) {
        if ((pIVar53->IO).KeyShift != false) {
          bVar59 = (pIVar53->IO).ConfigMacOSXBehaviors;
          if (bVar59 == false) {
            fVar73 = fVar62;
          }
          if (fVar62 == 0.0 || bVar59 != true) goto LAB_0013194c;
        }
        if (GImGui->WheelingWindow != pIVar39) {
          GImGui->WheelingWindow = pIVar39;
          pIVar58->WheelingWindowRefMousePos = (pIVar58->IO).MousePos;
          pIVar58->WheelingWindowTimer = 2.0;
        }
        uVar34 = pIVar39->Flags;
        while (((uVar34 >> 0x18 & 1) != 0 &&
               (((uVar34 & 0x210) == 0x10 ||
                ((fVar73 = (pIVar39->ScrollMax).y, fVar73 == 0.0 && (!NAN(fVar73)))))))) {
          pIVar39 = pIVar39->ParentWindow;
          uVar34 = pIVar39->Flags;
        }
        fVar73 = fVar82;
        if ((uVar34 & 0x210) == 0) {
          fVar73 = ((pIVar39->InnerRect).Max.y - (pIVar39->InnerRect).Min.y) * 0.67;
          fVar79 = pIVar58->FontBaseSize * pIVar39->FontWindowScale;
          if (pIVar39->ParentWindow != (ImGuiWindow *)0x0) {
            fVar79 = fVar79 * pIVar39->ParentWindow->FontWindowScale;
          }
          fVar74 = fVar79 * 5.0;
          if (fVar73 <= fVar79 * 5.0) {
            fVar74 = fVar73;
          }
          (pIVar39->ScrollTarget).y = (pIVar39->Scroll).y - fVar62 * (float)(int)fVar74;
          (pIVar39->ScrollTargetCenterRatio).y = 0.0;
          (pIVar39->ScrollTargetEdgeSnapDist).y = 0.0;
          fVar73 = fVar82;
        }
        goto LAB_0013194c;
      }
      if ((pIVar53->IO).FontAllowUserScaling == true) {
        if (GImGui->WheelingWindow != pIVar39) {
          GImGui->WheelingWindow = pIVar39;
          pIVar58->WheelingWindowRefMousePos = (pIVar58->IO).MousePos;
          pIVar58->WheelingWindowTimer = 2.0;
          fVar62 = (pIVar53->IO).MouseWheel;
        }
        fVar82 = pIVar39->FontWindowScale;
        fVar73 = fVar62 * 0.1 + fVar82;
        fVar62 = 2.5;
        if (fVar73 <= 2.5) {
          fVar62 = fVar73;
        }
        fVar62 = (float)(-(uint)(fVar73 < 0.5) & 0x3f000000 | ~-(uint)(fVar73 < 0.5) & (uint)fVar62)
        ;
        pIVar39->FontWindowScale = fVar62;
        if (pIVar39 == pIVar39->RootWindow) {
          fVar62 = fVar62 / fVar82;
          IVar64 = pIVar39->Size;
          auVar78._8_8_ = 0;
          auVar78._0_4_ = IVar64.x;
          auVar78._4_4_ = IVar64.y;
          IVar63 = (pIVar53->IO).MousePos;
          fVar82 = (pIVar39->Pos).x;
          fVar73 = (pIVar39->Pos).y;
          auVar81._0_4_ = (IVar63.x - fVar82) * (1.0 - fVar62) * IVar64.x;
          auVar81._4_4_ = (IVar63.y - fVar73) * (1.0 - fVar62) * IVar64.y;
          auVar81._8_8_ = 0;
          auVar72 = divps(auVar81,auVar78);
          local_48.Min.x = auVar72._0_4_ + fVar82;
          local_48.Min.y = auVar72._4_4_ + fVar73;
          SetWindowPos(pIVar39,&local_48.Min,0);
          IVar64 = pIVar39->SizeFull;
          IVar67.x = (float)(int)((pIVar39->Size).x * fVar62);
          IVar67.y = (float)(int)((pIVar39->Size).y * fVar62);
          pIVar39->Size = IVar67;
          (pIVar39->SizeFull).x = (float)(int)(IVar64.x * fVar62);
          (pIVar39->SizeFull).y = (float)(int)(IVar64.y * fVar62);
        }
      }
    }
    else if ((bVar59 & 1U) == 0) {
      if (((pIVar53->IO).KeyShift == true) && ((pIVar53->IO).ConfigMacOSXBehaviors == false)) {
        fVar73 = fVar62;
      }
LAB_0013194c:
      pIVar53 = GImGui;
      if ((fVar73 != 0.0) || (NAN(fVar73))) {
        if (GImGui->WheelingWindow != pIVar39) {
          GImGui->WheelingWindow = pIVar39;
          pIVar53->WheelingWindowRefMousePos = (pIVar53->IO).MousePos;
          pIVar53->WheelingWindowTimer = 2.0;
        }
        while ((uVar34 = pIVar39->Flags, (uVar34 >> 0x18 & 1) != 0 &&
               (((uVar34 & 0x210) == 0x10 ||
                ((fVar62 = (pIVar39->ScrollMax).x, fVar62 == 0.0 && (!NAN(fVar62)))))))) {
          pIVar39 = pIVar39->ParentWindow;
        }
        if ((uVar34 & 0x210) == 0) {
          fVar62 = ((pIVar39->InnerRect).Max.x - (pIVar39->InnerRect).Min.x) * 0.67;
          fVar82 = pIVar53->FontBaseSize * pIVar39->FontWindowScale;
          if (pIVar39->ParentWindow != (ImGuiWindow *)0x0) {
            fVar82 = fVar82 * pIVar39->ParentWindow->FontWindowScale;
          }
          fVar79 = fVar82 + fVar82;
          if (fVar62 <= fVar82 + fVar82) {
            fVar79 = fVar62;
          }
          (pIVar39->ScrollTarget).x = (pIVar39->Scroll).x - fVar73 * (float)(int)fVar79;
          (pIVar39->ScrollTargetCenterRatio).x = 0.0;
          (pIVar39->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  uVar34 = (pIVar26->Windows).Size;
  if ((int)uVar34 < (pIVar26->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                  ,0x115d,"void ImGui::NewFrame()");
  }
  fVar62 = 3.4028235e+38;
  if ((pIVar26->GcCompactAll == false) &&
     (fVar82 = (pIVar26->IO).ConfigMemoryCompactTimer, 0.0 <= fVar82)) {
    fVar62 = (float)pIVar26->Time - fVar82;
  }
  if (uVar34 != 0) {
    uVar54 = 0;
    do {
      if ((long)(int)uVar34 <= (long)uVar54) {
        pcVar44 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00131c6c;
      }
      pIVar39 = (pIVar26->Windows).Data[uVar54];
      bVar59 = pIVar39->Active;
      pIVar39->WasActive = bVar59;
      pIVar39->BeginCount = 0;
      pIVar39->Active = false;
      pIVar39->WriteAccessed = false;
      if (((bVar59 == false) && (pIVar39->MemoryCompacted == false)) &&
         (pIVar39->LastTimeActive <= fVar62 && fVar62 != pIVar39->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar39);
        uVar34 = (pIVar26->Windows).Size;
      }
      uVar54 = uVar54 + 1;
    } while (uVar54 != uVar34);
  }
  iVar47 = (pIVar26->TablesLastTimeActive).Size;
  if (0 < iVar47) {
    lVar55 = 0;
    lVar57 = 0;
    do {
      fVar82 = (pIVar26->TablesLastTimeActive).Data[lVar57];
      if ((0.0 <= fVar82) && (fVar82 < fVar62)) {
        if ((pIVar26->Tables).Buf.Size <= lVar57) {
          pcVar44 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_00131c6c;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar26->Tables).Buf.Data)->ID + lVar55));
        iVar47 = (pIVar26->TablesLastTimeActive).Size;
      }
      lVar57 = lVar57 + 1;
      lVar55 = lVar55 + 0x218;
    } while (lVar57 < iVar47);
  }
  iVar47 = (pIVar26->TablesTempData).Size;
  if (0 < iVar47) {
    lVar55 = 0;
    lVar57 = 0;
    do {
      pIVar18 = (pIVar26->TablesTempData).Data;
      fVar82 = *(float *)((long)&pIVar18->LastTimeActive + lVar55);
      if ((0.0 <= fVar82) && (fVar82 < fVar62)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar18->TableIndex + lVar55));
        iVar47 = (pIVar26->TablesTempData).Size;
      }
      lVar57 = lVar57 + 1;
      lVar55 = lVar55 + 0x70;
    } while (lVar57 < iVar47);
  }
  if (pIVar26->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar26->GcCompactAll = false;
  if ((pIVar26->NavWindow != (ImGuiWindow *)0x0) && (pIVar26->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar26->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar41 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar41 = *piVar41 + 1;
    }
    __dest_01 = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar19 = (pIVar26->CurrentWindowStack).Data;
    if (pIVar19 != (ImGuiWindowStackData *)0x0) {
      memcpy(__dest_01,pIVar19,(long)(pIVar26->CurrentWindowStack).Size * 0x58);
      pIVar19 = (pIVar26->CurrentWindowStack).Data;
      if ((pIVar19 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar41 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar41 = *piVar41 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar19,GImAllocatorUserData);
    }
    (pIVar26->CurrentWindowStack).Data = __dest_01;
    (pIVar26->CurrentWindowStack).Capacity = 0;
  }
  (pIVar26->CurrentWindowStack).Size = 0;
  if ((pIVar26->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar41 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar41 = *piVar41 + 1;
    }
    __dest_02 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar20 = (pIVar26->BeginPopupStack).Data;
    if (pIVar20 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_02,pIVar20,(long)(pIVar26->BeginPopupStack).Size * 0x38);
      pIVar20 = (pIVar26->BeginPopupStack).Data;
      if ((pIVar20 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar41 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar41 = *piVar41 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
    }
    (pIVar26->BeginPopupStack).Data = __dest_02;
    (pIVar26->BeginPopupStack).Capacity = 0;
  }
  (pIVar26->BeginPopupStack).Size = 0;
  iVar47 = (pIVar26->ItemFlagsStack).Capacity;
  if (iVar47 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar41 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar41 = *piVar41 + 1;
    }
    piVar40 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar41 = (pIVar26->ItemFlagsStack).Data;
    if (piVar41 != (int *)0x0) {
      memcpy(piVar40,piVar41,(long)(pIVar26->ItemFlagsStack).Size << 2);
      piVar41 = (pIVar26->ItemFlagsStack).Data;
      if ((piVar41 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar41,GImAllocatorUserData);
    }
    (pIVar26->ItemFlagsStack).Data = piVar40;
    (pIVar26->ItemFlagsStack).Size = 0;
    (pIVar26->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar26->ItemFlagsStack).Size = 0;
    if (iVar47 != 0) {
      piVar41 = (pIVar26->ItemFlagsStack).Data;
      lVar55 = 0;
      goto LAB_001310a0;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar41 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar41 = *piVar41 + 1;
  }
  piVar41 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar40 = (pIVar26->ItemFlagsStack).Data;
  if (piVar40 != (int *)0x0) {
    memcpy(piVar41,piVar40,(long)(pIVar26->ItemFlagsStack).Size << 2);
    piVar40 = (pIVar26->ItemFlagsStack).Data;
    if ((piVar40 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar4 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar4 = *piVar4 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar40,GImAllocatorUserData);
  }
  (pIVar26->ItemFlagsStack).Data = piVar41;
  (pIVar26->ItemFlagsStack).Capacity = 8;
  lVar55 = (long)(pIVar26->ItemFlagsStack).Size;
LAB_001310a0:
  piVar41[lVar55] = 0;
  (pIVar26->ItemFlagsStack).Size = (pIVar26->ItemFlagsStack).Size + 1;
  if ((pIVar26->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar41 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar41 = *piVar41 + 1;
    }
    __dest_03 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar21 = (pIVar26->GroupStack).Data;
    if (pIVar21 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_03,pIVar21,(long)(pIVar26->GroupStack).Size * 0x30);
      pIVar21 = (pIVar26->GroupStack).Data;
      if ((pIVar21 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar41 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar41 = *piVar41 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
    }
    (pIVar26->GroupStack).Data = __dest_03;
    (pIVar26->GroupStack).Capacity = 0;
  }
  (pIVar26->GroupStack).Size = 0;
  pIVar53 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar53->DebugItemPickerActive == true) {
    uVar34 = pIVar53->HoveredIdPreviousFrame;
    pIVar53->MouseCursor = 7;
    bVar59 = IsKeyPressed(0x20e,true);
    if (bVar59) {
      pIVar53->DebugItemPickerActive = false;
    }
    pIVar58 = GImGui;
    if (uVar34 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar53->DebugItemPickerBreakId = uVar34;
      pIVar53->DebugItemPickerActive = false;
    }
    pIVar5 = &pIVar58->NextWindowData;
    *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
    (pIVar58->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar34);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar34 == 0),"Click to break in debugger!");
    EndTooltip();
    pIVar53 = GImGui;
  }
  pIVar53->DebugHookIdInfo = 0;
  if (pIVar53->FrameCount == (pIVar53->DebugStackTool).LastActiveFrame + 1) {
    IVar48 = pIVar53->HoveredIdPreviousFrame;
    if (IVar48 == 0) {
      IVar48 = pIVar53->ActiveId;
    }
    if ((pIVar53->DebugStackTool).QueryId != IVar48) {
      (pIVar53->DebugStackTool).QueryId = IVar48;
      (pIVar53->DebugStackTool).StackLevel = -1;
      if ((pIVar53->DebugStackTool).Results.Capacity < 0) {
        piVar41 = &(pIVar53->IO).MetricsActiveAllocations;
        *piVar41 = *piVar41 + 1;
        __dest_04 = (ImGuiStackLevelInfo *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar22 = (pIVar53->DebugStackTool).Results.Data;
        if (pIVar22 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest_04,pIVar22,(long)(pIVar53->DebugStackTool).Results.Size << 6);
          pIVar22 = (pIVar53->DebugStackTool).Results.Data;
          if ((pIVar22 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar41 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar41 = *piVar41 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar22,GImAllocatorUserData);
        }
        (pIVar53->DebugStackTool).Results.Data = __dest_04;
        (pIVar53->DebugStackTool).Results.Capacity = 0;
      }
      (pIVar53->DebugStackTool).Results.Size = 0;
    }
    if (IVar48 != 0) {
      uVar34 = (pIVar53->DebugStackTool).StackLevel;
      lVar55 = (long)(int)uVar34;
      if (lVar55 < 0) {
        if (uVar34 == 0xffffffff) {
          pIVar53->DebugHookIdInfo = IVar48;
        }
      }
      else {
        iVar47 = (pIVar53->DebugStackTool).Results.Size;
        if (((int)uVar34 < iVar47) &&
           ((pIVar22 = (pIVar53->DebugStackTool).Results.Data, pIVar22[lVar55].QuerySuccess != false
            || ('\x02' < pIVar22[lVar55].QueryFrameCount)))) {
          uVar34 = uVar34 + 1;
          (pIVar53->DebugStackTool).StackLevel = uVar34;
        }
        if ((int)uVar34 < iVar47) {
          pIVar22 = (pIVar53->DebugStackTool).Results.Data;
          pIVar53->DebugHookIdInfo = pIVar22[uVar34].ID;
          pIVar7 = &pIVar22[uVar34].QueryFrameCount;
          *pIVar7 = *pIVar7 + '\x01';
        }
      }
    }
  }
  pIVar26->WithinFrameScopeWithImplicitWindow = true;
  pIVar53 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar53->NextWindowData).SizeVal.x = 400.0;
  (pIVar53->NextWindowData).SizeVal.y = 400.0;
  (pIVar53->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar26->CurrentWindow->IsFallbackWindow != false) {
    iVar47 = (pIVar26->Hooks).Size;
    if (0 < iVar47) {
      lVar55 = 0;
      lVar57 = 0;
      do {
        pIVar13 = (pIVar26->Hooks).Data;
        if (*(int *)(pIVar13 + lVar55 + 4) == 1) {
          (**(code **)(pIVar13 + lVar55 + 0x10))(pIVar26,pIVar13 + lVar55);
          iVar47 = (pIVar26->Hooks).Size;
        }
        lVar57 = lVar57 + 1;
        lVar55 = lVar55 + 0x20;
      } while (lVar57 < iVar47);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x118d,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Clear ActiveID if the item is not alive anymore.
    // In 1.87, the common most call to KeepAliveID() was moved from GetID() to ItemAdd().
    // As a result, custom widget using ButtonBehavior() _without_ ItemAdd() need to call KeepAliveID() themselves.
    if (g.ActiveId != 0 && g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("NewFrame(): ClearActiveID() because it isn't marked alive anymore!\n");
        ClearActiveID();
    }

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}